

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,uint c)

{
  undefined1 local_38 [8];
  ImGuiInputEvent e;
  ImGuiContext *g;
  uint c_local;
  ImGuiIO *this_local;
  
  e._16_8_ = GImGui;
  if (&GImGui->IO == this) {
    if (c != 0) {
      ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)local_38);
      local_38._0_4_ = ImGuiInputEventType_Text;
      local_38._4_4_ = ImGuiInputSource_Keyboard;
      e.Type = c;
      ImVector<ImGuiInputEvent>::push_back
                ((ImVector<ImGuiInputEvent> *)(e._16_8_ + 0x38e8),(ImGuiInputEvent *)local_38);
    }
    return;
  }
  __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x4be,"void ImGuiIO::AddInputCharacter(unsigned int)");
}

Assistant:

void ImGuiIO::AddInputCharacter(unsigned int c)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if (c == 0)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Text;
    e.Source = ImGuiInputSource_Keyboard;
    e.Text.Char = c;
    g.InputEventsQueue.push_back(e);
}